

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<HashWriter,int,uint256,uint256,unsigned_int,unsigned_int,unsigned_int>
               (HashWriter *s,int *args,uint256 *args_1,uint256 *args_2,uint *args_3,uint *args_4,
               uint *args_5)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata32<HashWriter>(s,*args);
  base_blob<256U>::Serialize<HashWriter>(&args_1->super_base_blob<256U>,s);
  base_blob<256U>::Serialize<HashWriter>(&args_2->super_base_blob<256U>,s);
  ser_writedata32<HashWriter>(s,*args_3);
  ser_writedata32<HashWriter>(s,*args_4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata32<HashWriter>(s,*args_5);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}